

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O3

void player_spells_init(player *p)

{
  wchar_t wVar1;
  uint8_t *puVar2;
  size_t sVar3;
  size_t len;
  
  wVar1 = (p->class->magic).total_spells;
  len = (size_t)wVar1;
  if (len != 0) {
    puVar2 = (uint8_t *)mem_zalloc(len);
    p->spell_flags = puVar2;
    puVar2 = (uint8_t *)mem_zalloc(len);
    p->spell_order = puVar2;
    if (L'\0' < wVar1) {
      sVar3 = 0;
      do {
        p->spell_order[sVar3] = 'c';
        sVar3 = sVar3 + 1;
      } while (len != sVar3);
    }
  }
  return;
}

Assistant:

void player_spells_init(struct player *p)
{
	int i, num_spells = p->class->magic.total_spells;

	/* None */
	if (!num_spells) return;

	/* Allocate */
	p->spell_flags = mem_zalloc(num_spells * sizeof(uint8_t));
	p->spell_order = mem_zalloc(num_spells * sizeof(uint8_t));

	/* None of the spells have been learned yet */
	for (i = 0; i < num_spells; i++)
		p->spell_order[i] = 99;
}